

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test::
~TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test
          (TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test *this)

{
  TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test *this_local;
  
  ~TEST_MockParameterTest_expectOneMemBufferParameterAndValueFailsDueToSize_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneMemBufferParameterAndValueFailsDueToSize)
{
    MockFailureReporterInstaller failureReporterInstaller;

    unsigned char memBuffer1[] = { 0x12, 0x15, 0xFF };
    unsigned char memBuffer2[] = { 0x12, 0x15, 0xFF, 0x90 };

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", memBuffer1, sizeof(memBuffer1));
    MockNamedValue parameter("parameter");
    parameter.setMemoryBuffer( memBuffer2, sizeof(memBuffer2) );
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", memBuffer1, sizeof(memBuffer1));
    mock().actualCall("foo").withParameter("parameter", memBuffer2, sizeof(memBuffer2));

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}